

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenType BinaryenArrayTypeGetElementType(BinaryenHeapType heapType)

{
  bool bVar1;
  TypeID TVar2;
  HeapType local_28 [2];
  HeapType local_18;
  HeapType ht;
  BinaryenHeapType heapType_local;
  
  ht.id = heapType;
  wasm::HeapType::HeapType(&local_18,heapType);
  bVar1 = wasm::HeapType::isArray(&local_18);
  if (!bVar1) {
    __assert_fail("ht.isArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x161,"BinaryenType BinaryenArrayTypeGetElementType(BinaryenHeapType)");
  }
  wasm::HeapType::getArray(local_28);
  TVar2 = wasm::Type::getID((Type *)local_28);
  return TVar2;
}

Assistant:

BinaryenType BinaryenArrayTypeGetElementType(BinaryenHeapType heapType) {
  auto ht = HeapType(heapType);
  assert(ht.isArray());
  return ht.getArray().element.type.getID();
}